

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O3

void ssh2_bpp_format_packet(ssh2_bpp_state *s,PktOut *pkt)

{
  BinarySink *bs;
  ssh_cipher *psVar1;
  ssh2_mac *psVar2;
  size_t sVar3;
  PktOut *pkt_00;
  int iVar4;
  ulong val;
  int iVar5;
  ulong uVar6;
  
  uVar6 = pkt->minlen;
  if ((uVar6 != 0) && (s->out_comp == (ssh_compressor *)0x0)) {
    psVar1 = (s->out).cipher;
    if (psVar1 == (ssh_cipher *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = psVar1->vt->blksize;
    }
    iVar5 = 8;
    if (8 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = iVar5 + (int)pkt->length + 3;
    iVar4 = iVar4 - iVar4 % iVar5;
    psVar2 = (s->out).mac;
    if (psVar2 == (ssh2_mac *)0x0) {
      if (uVar6 <= (ulong)(long)iVar4) goto LAB_00119a8a;
    }
    else {
      iVar5 = psVar2->vt->len;
      iVar4 = iVar4 + iVar5;
      if (uVar6 <= (ulong)(long)iVar4) goto LAB_00119a8a;
      iVar4 = iVar4 + iVar5;
    }
    iVar4 = (int)uVar6 - iVar4;
    iVar5 = 0xd;
    if (0xd < iVar4) {
      iVar5 = iVar4;
    }
    val = (ulong)(iVar5 - 0xdU);
    pkt_00 = ssh_new_packet();
    pkt_00->length = 5;
    pkt_00->minlen = 0;
    pkt_00->type = 2;
    bs = pkt_00->binarysink_;
    BinarySink_put_byte(bs,'\x02');
    pkt_00->prefix = pkt_00->length;
    BinarySink_put_uint32(bs,val);
    sVar3 = pkt_00->length;
    uVar6 = val;
    if (iVar5 - 0xdU != 0) {
      do {
        BinarySink_put_byte(bs,'\0');
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    random_read(pkt_00->data + sVar3,val);
    ssh2_bpp_format_packet_inner(s,pkt_00);
    bufchain_add((s->bpp).out_raw,pkt_00->data,pkt_00->length);
    ssh_free_pktout(pkt_00);
  }
LAB_00119a8a:
  ssh2_bpp_format_packet_inner(s,pkt);
  bufchain_add((s->bpp).out_raw,pkt->data,pkt->length);
  return;
}

Assistant:

static void ssh2_bpp_format_packet(struct ssh2_bpp_state *s, PktOut *pkt)
{
    if (pkt->minlen > 0 && !s->out_comp) {
        /*
         * If we've been told to pad the packet out to a given minimum
         * length, but we're not compressing (and hence can't get the
         * compression to do the padding by pointlessly opening and
         * closing zlib blocks), then our other strategy is to precede
         * this message with an SSH_MSG_IGNORE that makes it up to the
         * right length.
         *
         * A third option in principle, and the most obviously
         * sensible, would be to set the explicit padding field in the
         * packet to more than its minimum value. Sadly, that turns
         * out to break some servers (our institutional memory thinks
         * Cisco in particular) and so we abandoned that idea shortly
         * after trying it.
         */

        /*
         * Calculate the length we expect the real packet to have.
         */
        int block, length;
        PktOut *ignore_pkt;

        block = s->out.cipher ? ssh_cipher_alg(s->out.cipher)->blksize : 0;
        if (block < 8)
            block = 8;
        length = pkt->length;
        length += 4;       /* minimum 4 byte padding */
        length += block-1;
        length -= (length % block);
        if (s->out.mac)
            length += ssh2_mac_alg(s->out.mac)->len;

        if (length < pkt->minlen) {
            /*
             * We need an ignore message. Calculate its length.
             */
            length = pkt->minlen - length;

            /*
             * And work backwards from that to the length of the
             * contained string.
             */
            if (s->out.mac)
                length -= ssh2_mac_alg(s->out.mac)->len;
            length -= 8;               /* length field + min padding */
            length -= 5;               /* type code + string length prefix */

            if (length < 0)
                length = 0;

            ignore_pkt = ssh2_bpp_new_pktout(SSH2_MSG_IGNORE);
            put_uint32(ignore_pkt, length);
            size_t origlen = ignore_pkt->length;
            for (size_t i = 0; i < length; i++)
                put_byte(ignore_pkt, 0);  /* make space for random padding */
            random_read(ignore_pkt->data + origlen, length);
            ssh2_bpp_format_packet_inner(s, ignore_pkt);
            bufchain_add(s->bpp.out_raw, ignore_pkt->data, ignore_pkt->length);
            ssh_free_pktout(ignore_pkt);
        }
    }

    ssh2_bpp_format_packet_inner(s, pkt);
    bufchain_add(s->bpp.out_raw, pkt->data, pkt->length);
}